

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALOwnedRegion(UINT_PTR address)

{
  CPalThread *pThread;
  PCMI p_Var1;
  CPalThread *pthrCurrent;
  PCMI pEntry;
  UINT_PTR address_local;
  
  pThread = CorUnix::InternalGetCurrentThread();
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  p_Var1 = VIRTUALFindRegionInformation(address);
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  return (BOOL)(p_Var1 != (PCMI)0x0);
}

Assistant:

BOOL VIRTUALOwnedRegion( IN UINT_PTR address )
{
    PCMI pEntry = NULL;
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);
    pEntry = VIRTUALFindRegionInformation( address );
    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    return pEntry != NULL;
}